

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.h
# Opt level: O1

int IssueCommandRoboteq(ROBOTEQ *pRoboteq,char *commandType,char *command,char *args,int waitms,
                       char *response,BOOL bPlusMinus)

{
  int iVar1;
  FILE *pFVar2;
  bool bVar3;
  size_t sVar4;
  ssize_t sVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  void *pvVar12;
  int Bytes;
  timespec *str;
  int Bytes_1;
  int plen;
  char *p;
  char recvbuf [2048];
  char tmp [256];
  char sendbuf [2048];
  uint local_114c;
  char *local_1148;
  undefined8 local_1140;
  timespec local_1138 [128];
  char local_938 [256];
  char local_838 [2056];
  
  memset(local_838,0,0x800);
  if (*args == '\0') {
    sprintf(local_838,"%.255s%.255s\r",commandType,command);
  }
  else {
    sprintf(local_838,"%.255s%.255s %.255s\r",commandType,command,args);
  }
  sVar4 = strlen(local_838);
  iVar7 = (pRoboteq->RS232Port).DevType;
  uVar8 = (uint)sVar4;
  local_1148 = response;
  if (iVar7 - 1U < 4) {
    if (0 < (int)uVar8) {
      iVar7 = (pRoboteq->RS232Port).s;
      uVar9 = 0;
      do {
        sVar5 = send(iVar7,local_838 + uVar9,(long)(int)(uVar8 - (int)uVar9),0);
        if ((int)sVar5 < 1) {
          return 1;
        }
        uVar10 = (int)uVar9 + (int)sVar5;
        uVar9 = (ulong)uVar10;
      } while ((int)uVar10 < (int)uVar8);
    }
  }
  else {
    if (iVar7 != 0) {
      return 1;
    }
    if (uVar8 != 0) {
      iVar7 = *(int *)&(pRoboteq->RS232Port).hDev;
      uVar9 = 0;
      do {
        sVar5 = write(iVar7,local_838 + uVar9,(ulong)(uVar8 - (int)uVar9));
        if ((int)sVar5 < 1) {
          return 1;
        }
        uVar10 = (int)uVar9 + (int)sVar5;
        uVar9 = (ulong)uVar10;
      } while (uVar10 < uVar8);
    }
  }
  if ((pRoboteq->bSaveRawData != 0) && ((FILE *)pRoboteq->pfSaveFile != (FILE *)0x0)) {
    fwrite(local_838,(long)(int)uVar8,1,(FILE *)pRoboteq->pfSaveFile);
    fflush((FILE *)pRoboteq->pfSaveFile);
  }
  local_1138[0].tv_sec = (long)waitms / 1000;
  local_1138[0].tv_nsec = ((long)waitms % 1000) * 1000000;
  sVar5 = 0;
  nanosleep(local_1138,(timespec *)0x0);
  if (pRoboteq->bEcho != 0) {
    memset(local_1138,0,0x800);
    uVar9 = 0;
    while ((iVar7 = (int)uVar9, iVar7 < 1 || (*(char *)((long)&local_1140 + uVar9 + 7) != '\r'))) {
      if (0x7fe < iVar7) {
        return 1;
      }
      pvVar12 = (void *)((long)&local_1138[0].tv_sec + (long)iVar7);
      iVar1 = (pRoboteq->RS232Port).DevType;
      if (iVar1 - 1U < 4) {
        sVar5 = recv((pRoboteq->RS232Port).s,pvVar12,1,0);
LAB_001adbd4:
        bVar3 = (int)sVar5 < 1;
      }
      else {
        bVar3 = true;
        if (iVar1 == 0) {
          sVar5 = read(*(int *)&(pRoboteq->RS232Port).hDev,pvVar12,1);
          goto LAB_001adbd4;
        }
      }
      if (bVar3) {
        return 1;
      }
      uVar9 = (ulong)(uint)(iVar7 + (int)sVar5);
      if ((int)sVar5 == 0) {
        return 1;
      }
    }
    if ((pRoboteq->bSaveRawData != 0) &&
       (pFVar2 = (FILE *)pRoboteq->pfSaveFile, pFVar2 != (FILE *)0x0)) {
      sVar4 = strlen((char *)local_1138);
      fwrite(local_1138,sVar4,1,pFVar2);
      fflush((FILE *)pRoboteq->pfSaveFile);
    }
  }
  str = local_1138;
  sVar5 = 0;
  memset(str,0,0x800);
  uVar8 = 0;
  do {
    if ((0 < (int)uVar8) && (*(char *)((long)&local_1140 + (ulong)uVar8 + 7) == '\r')) {
      if ((pRoboteq->bSaveRawData != 0) &&
         (pFVar2 = (FILE *)pRoboteq->pfSaveFile, pFVar2 != (FILE *)0x0)) {
        sVar4 = strlen((char *)local_1138);
        fwrite(local_1138,sVar4,1,pFVar2);
        fflush((FILE *)pRoboteq->pfSaveFile);
      }
      if (bPlusMinus == 0) {
        sprintf(local_938,"%.254s=",command);
        pcVar11 = (char *)0x0;
        uVar8 = 0;
        while( true ) {
          local_114c = 0;
          pcVar6 = stristrbeginend((char *)str,local_938,"\r",(char **)&local_1140,
                                   (int *)&local_114c);
          uVar10 = local_114c;
          if (pcVar6 == (char *)0x0) break;
          local_1140 = pcVar6;
          sVar4 = strlen(local_938);
          str = (timespec *)(pcVar6 + (1 - sVar4));
          pcVar11 = pcVar6;
          uVar8 = uVar10;
        }
        local_1140 = (char *)0x0;
        if (pcVar11 != (char *)0x0) {
          local_1140 = pcVar6;
          sprintf(local_1148,"%.*s",(ulong)uVar8,pcVar11);
          return 0;
        }
      }
      else {
        sVar4 = strlen((char *)local_1138);
        if (1 < sVar4) {
          *local_1148 = *(char *)((long)local_1138 + (sVar4 - 2));
          local_1148[1] = '\0';
          return 0;
        }
      }
      puts("Error reading data from a Roboteq. ");
      return 1;
    }
    if (0x7fe < (int)uVar8) {
      return 1;
    }
    pvVar12 = (void *)((long)&local_1138[0].tv_sec + (long)(int)uVar8);
    iVar7 = (pRoboteq->RS232Port).DevType;
    if (iVar7 - 1U < 4) {
      sVar5 = recv((pRoboteq->RS232Port).s,pvVar12,1,0);
LAB_001adcac:
      bVar3 = (int)sVar5 < 1;
    }
    else {
      bVar3 = true;
      if (iVar7 == 0) {
        sVar5 = read(*(int *)&(pRoboteq->RS232Port).hDev,pvVar12,1);
        goto LAB_001adcac;
      }
    }
    if (bVar3) {
      return 1;
    }
    uVar8 = uVar8 + (int)sVar5;
    if ((int)sVar5 == 0) {
      return 1;
    }
  } while( true );
}

Assistant:

inline int IssueCommandRoboteq(ROBOTEQ* pRoboteq, char* commandType, char* command, char* args, int waitms, char* response, BOOL bPlusMinus)
{
	char sendbuf[MAX_NB_BYTES_ROBOTEQ];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_ROBOTEQ];
	int recvbuflen = 0;
	char tmp[256];
	char* resp = NULL;
	int respstrlen = 0;
	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	if (strlen(args) <= 0) sprintf(sendbuf, "%.255s%.255s\r", commandType, command);
	else sprintf(sendbuf, "%.255s%.255s %.255s\r", commandType, command, args);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteAllRS232Port(&pRoboteq->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pRoboteq->bSaveRawData)&&(pRoboteq->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pRoboteq->pfSaveFile);
		fflush(pRoboteq->pfSaveFile);
	}

	mSleep(waitms);
	
	if (pRoboteq->bEcho)
	{
		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = MAX_NB_BYTES_ROBOTEQ-1; // Ensure it will be a null-terminated string.

		if (ReadUntilRS232Port(&pRoboteq->RS232Port, (unsigned char*)recvbuf, '\r', recvbuflen) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if ((pRoboteq->bSaveRawData)&&(pRoboteq->pfSaveFile))
		{
			fwrite(recvbuf, strlen(recvbuf), 1, pRoboteq->pfSaveFile);
			fflush(pRoboteq->pfSaveFile);
		}
	}
	
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_ROBOTEQ-1; // Ensure it will be a null-terminated string.

	if (ReadUntilRS232Port(&pRoboteq->RS232Port, (unsigned char*)recvbuf, '\r', recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pRoboteq->bSaveRawData)&&(pRoboteq->pfSaveFile))
	{
		fwrite(recvbuf, strlen(recvbuf), 1, pRoboteq->pfSaveFile);
		fflush(pRoboteq->pfSaveFile);
	}

	// Check for "+\r" or "-\r".
	if (bPlusMinus)
	{
		if (strlen(recvbuf) < 2)
		{
			printf("Error reading data from a Roboteq. \n");
			return EXIT_FAILURE;
		}
		sprintf(response, "%c", recvbuf[strlen(recvbuf)-2]);
		return EXIT_SUCCESS;
	}
	
	sprintf(tmp, "%.254s=", command);
	if (!rstristrbeginend(recvbuf, tmp, "\r", &resp, &respstrlen))
	{
		printf("Error reading data from a Roboteq. \n");
		return EXIT_FAILURE;
	}
	sprintf(response, "%.*s", respstrlen, resp);

	return EXIT_SUCCESS;
}